

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O3

void dict2pid_dump(FILE *fp,dict2pid_t *d2p)

{
  bin_mdef_t *m;
  dict_t *pdVar1;
  s3ssid_t sVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  m = d2p->mdef;
  pdVar1 = d2p->dict;
  fwrite("# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n",0x33,1,(FILE *)fp);
  if (0 < pdVar1->n_word) {
    lVar7 = 0;
    do {
      fprintf((FILE *)fp,"%30s ",pdVar1->word[lVar7].word);
      iVar3 = pdVar1->word[lVar7].pronlen;
      if (0 < iVar3) {
        iVar8 = 0;
        do {
          sVar2 = dict2pid_internal(d2p,(int32)lVar7,iVar8);
          fprintf((FILE *)fp," %5d",(ulong)sVar2);
          iVar8 = iVar8 + 1;
        } while (iVar3 != iVar8);
      }
      fputc(10,(FILE *)fp);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pdVar1->n_word);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# LDIPH_LC (b r l ssid)\n",0x18,1,(FILE *)fp);
  iVar3 = m->n_ciphone;
  if (0 < iVar3) {
    lVar7 = 0;
    do {
      if (0 < iVar3) {
        lVar9 = 0;
        do {
          if (0 < iVar3) {
            iVar8 = 0;
            lVar11 = 0;
            do {
              if (d2p->ldiph_lc[lVar7][lVar9][lVar11] != 0xffff) {
                pcVar4 = bin_mdef_ciphone_str(m,(int)(short)lVar7);
                pcVar5 = bin_mdef_ciphone_str(m,(int)(short)lVar9);
                pcVar6 = bin_mdef_ciphone_str(m,iVar8 >> 0x10);
                fprintf((FILE *)fp,"%6s %6s %6s %5d\n",pcVar4,pcVar5,pcVar6,
                        (ulong)d2p->ldiph_lc[lVar7][lVar9][lVar11]);
                iVar3 = m->n_ciphone;
              }
              lVar11 = lVar11 + 1;
              iVar8 = iVar8 + 0x10000;
            } while (lVar11 < iVar3);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar3);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# SSEQ %d (senid senid ...)\n",(ulong)(uint)m->n_sseq);
  if (0 < m->n_sseq) {
    uVar10 = 0;
    do {
      fprintf((FILE *)fp,"%5d ",uVar10 & 0xffffffff);
      if (0 < m->n_emit_state) {
        lVar7 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)m->sseq[uVar10][lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < m->n_emit_state);
      }
      fputc(10,(FILE *)fp);
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)m->n_sseq);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# END\n",6,1,(FILE *)fp);
  fflush((FILE *)fp);
  return;
}

Assistant:

void
dict2pid_dump(FILE * fp, dict2pid_t * d2p)
{
    int32 w, p, pronlen;
    int32 i, j, b, l, r;
    bin_mdef_t *mdef = d2p->mdef;
    dict_t *dict = d2p->dict;

    fprintf(fp, "# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
    for (w = 0; w < dict_size(dict); w++) {
        fprintf(fp, "%30s ", dict_wordstr(dict, w));

        pronlen = dict_pronlen(dict, w);
        for (p = 0; p < pronlen; p++)
            fprintf(fp, " %5d", dict2pid_internal(d2p, w, p));
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# LDIPH_LC (b r l ssid)\n");
    for (b = 0; b < bin_mdef_n_ciphone(mdef); b++) {
        for (r = 0; r < bin_mdef_n_ciphone(mdef); r++) {
            for (l = 0; l < bin_mdef_n_ciphone(mdef); l++) {
                if (IS_S3SSID(d2p->ldiph_lc[b][r][l]))
                    fprintf(fp, "%6s %6s %6s %5d\n", bin_mdef_ciphone_str(mdef, (s3cipid_t) b), bin_mdef_ciphone_str(mdef, (s3cipid_t) r), bin_mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->ldiph_lc[b][r][l]);      /* RAH, ldiph_lc is returning an int32, %d expects an int16 */
            }
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SSEQ %d (senid senid ...)\n", mdef->n_sseq);
    for (i = 0; i < mdef->n_sseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < bin_mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", mdef->sseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");
    fprintf(fp, "# END\n");

    fflush(fp);
}